

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::choose<vk::VkFormat_const*,vk::VkFormat*>
          (Random *this,VkFormat *first,VkFormat *last,VkFormat *result,int numItems)

{
  int iVar1;
  int local_30;
  int r;
  int ndx;
  int numItems_local;
  VkFormat *result_local;
  VkFormat *last_local;
  VkFormat *first_local;
  Random *this_local;
  
  local_30 = 0;
  for (last_local = first; last_local != last; last_local = last_local + 1) {
    if (local_30 < numItems) {
      result[local_30] = *last_local;
    }
    else {
      iVar1 = getInt(this,0,local_30);
      if (iVar1 < numItems) {
        result[iVar1] = *last_local;
      }
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}